

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O3

int gpioCfgInterfaces(uint ifFlags)

{
  int iVar1;
  
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    gpioCfgInterfaces_cold_1();
  }
  if (libInitialised == '\x01') {
    iVar1 = -0x20;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioCfgInterfaces_cold_3();
    }
  }
  else if (ifFlags < 0x10) {
    iVar1 = 0;
    gpioCfg.ifFlags = ifFlags;
  }
  else {
    iVar1 = -0x1a;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioCfgInterfaces_cold_2();
    }
  }
  return iVar1;
}

Assistant:

int gpioCfgInterfaces(unsigned ifFlags)
{
   DBG(DBG_USER, "ifFlags=%X", ifFlags);

   CHECK_NOT_INITED;

   if (ifFlags > 15)
      SOFT_ERROR(PI_BAD_IF_FLAGS, "bad ifFlags (%X)", ifFlags);

   gpioCfg.ifFlags = ifFlags;

   return 0;
}